

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  uint uVar1;
  CppType CVar2;
  int iVar3;
  EnumValueDescriptor *pEVar4;
  int *piVar5;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    iVar3 = *(int *)(field + 0x44);
    pEVar4 = FieldDescriptor::default_value_enum(field);
    iVar3 = internal::ExtensionSet::GetEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),iVar3,
                       *(int *)(pEVar4 + 0x10));
    return iVar3;
  }
  piVar5 = GetRaw<int>(this,message,field);
  return *piVar5;
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32 value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}